

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.cpp
# Opt level: O2

void read_pic_parameter_set_rbsp(h264_stream_t *h,bs_t *b)

{
  pps_t *__s;
  uint32_t uVar1;
  int32_t iVar2;
  int iVar3;
  int **ppiVar4;
  uint *puVar5;
  bs_t *b_00;
  ulong uVar6;
  long lVar7;
  int **ppiVar8;
  
  uVar1 = bs_read_ue(b);
  __s = h->pps_table[(int)uVar1];
  h->pps = __s;
  memset(__s,0,0x168);
  __s->pic_parameter_set_id = uVar1;
  uVar1 = bs_read_ue(b);
  __s->seq_parameter_set_id = uVar1;
  uVar1 = bs_read_u1(b);
  __s->entropy_coding_mode_flag = uVar1;
  puVar5 = (uint *)h->info;
  ((videoinfo_t *)puVar5)->encoding_type = uVar1;
  uVar1 = bs_read_u1(b);
  __s->bottom_field_pic_order_in_frame_present_flag = uVar1;
  uVar1 = bs_read_ue(b);
  __s->num_slice_groups_minus1 = uVar1;
  if (0 < (int)uVar1) {
    uVar1 = bs_read_ue(b);
    __s->slice_group_map_type = uVar1;
    puVar5 = &switchD_00106581::switchdataD_0010e09c;
    switch(uVar1) {
    case 0:
      for (lVar7 = 0; lVar7 <= __s->num_slice_groups_minus1; lVar7 = lVar7 + 1) {
        uVar1 = bs_read_ue(b);
        __s->run_length_minus1[lVar7] = uVar1;
      }
      break;
    case 2:
      for (lVar7 = 0; lVar7 < __s->num_slice_groups_minus1; lVar7 = lVar7 + 1) {
        uVar1 = bs_read_ue(b);
        __s->top_left[lVar7] = uVar1;
        uVar1 = bs_read_ue(b);
        __s->bottom_right[lVar7] = uVar1;
      }
      break;
    case 3:
    case 4:
    case 5:
      uVar1 = bs_read_u1(b);
      __s->slice_group_change_direction_flag = uVar1;
      uVar1 = bs_read_ue(b);
      __s->slice_group_change_rate_minus1 = uVar1;
      break;
    case 6:
      uVar1 = bs_read_ue(b);
      __s->pic_size_in_map_units_minus1 = uVar1;
      iVar3 = intlog2(__s->num_slice_groups_minus1 + 1);
      __s->slice_group_id_bytes = iVar3;
      std::vector<int,_std::allocator<int>_>::resize(&__s->slice_group_id,(long)(int)(uVar1 + 1));
      for (lVar7 = 0; lVar7 <= __s->pic_size_in_map_units_minus1; lVar7 = lVar7 + 1) {
        uVar1 = bs_read_u(b,__s->slice_group_id_bytes);
        puVar5 = (uint *)(__s->slice_group_id).super__Vector_base<int,_std::allocator<int>_>._M_impl
                         .super__Vector_impl_data._M_start;
        (&((videoinfo_t *)puVar5)->type)[lVar7] = uVar1;
      }
    }
  }
  uVar1 = bs_read_ue(b);
  __s->num_ref_idx_l0_active_minus1 = uVar1;
  uVar1 = bs_read_ue(b);
  __s->num_ref_idx_l1_active_minus1 = uVar1;
  uVar1 = bs_read_u1(b);
  __s->weighted_pred_flag = uVar1;
  b_00 = (bs_t *)0x2;
  uVar1 = bs_read_u(b,2);
  __s->weighted_bipred_idc = uVar1;
  iVar2 = bs_read_se(b);
  __s->pic_init_qp_minus26 = iVar2;
  iVar2 = bs_read_se(b);
  __s->pic_init_qs_minus26 = iVar2;
  iVar2 = bs_read_se(b);
  __s->chroma_qp_index_offset = iVar2;
  uVar1 = bs_read_u1(b);
  __s->deblocking_filter_control_present_flag = uVar1;
  uVar1 = bs_read_u1(b);
  __s->constrained_intra_pred_flag = uVar1;
  uVar1 = bs_read_u1(b);
  __s->redundant_pic_cnt_present_flag = uVar1;
  iVar3 = more_rbsp_data_in_pps(h,b_00);
  __s->_more_rbsp_data_present = iVar3;
  if (iVar3 != 0) {
    uVar1 = bs_read_u1(b);
    __s->transform_8x8_mode_flag = uVar1;
    uVar1 = bs_read_u1(b);
    __s->pic_scaling_matrix_present_flag = uVar1;
    if (uVar1 != 0) {
      ppiVar8 = __s->ScalingList4x4 + 3;
      for (uVar6 = 0; (long)uVar6 < (long)__s->transform_8x8_mode_flag * 2 + 6; uVar6 = uVar6 + 1) {
        uVar1 = bs_read_u1(b);
        __s->pic_scaling_list_present_flag[uVar6] = uVar1;
        if (uVar1 != 0) {
          ppiVar4 = ppiVar8 + -3;
          if (5 < uVar6) {
            ppiVar4 = ppiVar8;
          }
          iVar3 = 0x40;
          if (5 >= uVar6) {
            iVar3 = 0x10;
          }
          read_scaling_list(b,*ppiVar4,iVar3,(int)puVar5);
        }
        ppiVar8 = ppiVar8 + 1;
      }
    }
    h = (h264_stream_t *)b;
    iVar2 = bs_read_se(b);
    __s->second_chroma_qp_index_offset = iVar2;
  }
  read_rbsp_trailing_bits(h,b);
  return;
}

Assistant:

void read_pic_parameter_set_rbsp(h264_stream_t* h, bs_t* b)
{
    int pps_id = bs_read_ue(b);
    pps_t* pps = h->pps = h->pps_table[pps_id] ;

    memset(pps, 0, sizeof(pps_t));

    int i;
    int i_group;

    pps->pic_parameter_set_id = pps_id;
    pps->seq_parameter_set_id = bs_read_ue(b);
    pps->entropy_coding_mode_flag = bs_read_u1(b);

    // add by Late Lee
    h->info->encoding_type = pps->entropy_coding_mode_flag;

    //2005年版本此处为pps->pic_order_present_flag，2013年版本为bottom_field_pic_order_in_frame_present_flag
    pps->bottom_field_pic_order_in_frame_present_flag = bs_read_u1(b);
    pps->num_slice_groups_minus1 = bs_read_ue(b);

    if( pps->num_slice_groups_minus1 > 0 )
    {
        pps->slice_group_map_type = bs_read_ue(b);
        if( pps->slice_group_map_type == 0 )
        {
            for( i_group = 0; i_group <= pps->num_slice_groups_minus1; i_group++ )
            {
                pps->run_length_minus1[ i_group ] = bs_read_ue(b);
            }
        }
        else if( pps->slice_group_map_type == 2 )
        {
            for( i_group = 0; i_group < pps->num_slice_groups_minus1; i_group++ )
            {
                pps->top_left[ i_group ] = bs_read_ue(b);
                pps->bottom_right[ i_group ] = bs_read_ue(b);
            }
        }
        else if( pps->slice_group_map_type == 3 ||
                 pps->slice_group_map_type == 4 ||
                 pps->slice_group_map_type == 5 )
        {
            pps->slice_group_change_direction_flag = bs_read_u1(b);
            pps->slice_group_change_rate_minus1 = bs_read_ue(b);
        }
        else if( pps->slice_group_map_type == 6 )
        {
            pps->pic_size_in_map_units_minus1 = bs_read_ue(b);
            pps->slice_group_id_bytes = intlog2( pps->num_slice_groups_minus1 + 1 );
            pps->slice_group_id.resize(pps->pic_size_in_map_units_minus1 + 1);
            for( i = 0; i <= pps->pic_size_in_map_units_minus1; i++ )
            {
                pps->slice_group_id[ i ] = bs_read_u(b,  pps->slice_group_id_bytes); // was u(v)
            }
        }
    }
    pps->num_ref_idx_l0_active_minus1 = bs_read_ue(b);
    pps->num_ref_idx_l1_active_minus1 = bs_read_ue(b);
    pps->weighted_pred_flag = bs_read_u1(b);
    pps->weighted_bipred_idc = bs_read_u(b,2);
    pps->pic_init_qp_minus26 = bs_read_se(b);
    pps->pic_init_qs_minus26 = bs_read_se(b);
    pps->chroma_qp_index_offset = bs_read_se(b);
    pps->deblocking_filter_control_present_flag = bs_read_u1(b);
    pps->constrained_intra_pred_flag = bs_read_u1(b);
    pps->redundant_pic_cnt_present_flag = bs_read_u1(b);

    pps->_more_rbsp_data_present = more_rbsp_data_in_pps(h, b);
    if( pps->_more_rbsp_data_present )
    {
        pps->transform_8x8_mode_flag = bs_read_u1(b);
        pps->pic_scaling_matrix_present_flag = bs_read_u1(b);
        if( pps->pic_scaling_matrix_present_flag )
        {
            for( i = 0; i < 6 + 2* pps->transform_8x8_mode_flag; i++ )
            {
                pps->pic_scaling_list_present_flag[ i ] = bs_read_u1(b);
                if( pps->pic_scaling_list_present_flag[ i ] )
                {
                    if( i < 6 )
                    {
                        read_scaling_list( b, pps->ScalingList4x4[ i ], 16,
                                           pps->UseDefaultScalingMatrix4x4Flag[ i ] );
                    }
                    else
                    {
                        read_scaling_list( b, pps->ScalingList8x8[ i - 6 ], 64,
                                           pps->UseDefaultScalingMatrix8x8Flag[ i - 6 ] );
                    }
                }
            }
        }
        pps->second_chroma_qp_index_offset = bs_read_se(b);
    }
    read_rbsp_trailing_bits(h, b);
}